

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
anon_unknown.dwarf_1461ac2::ScriptMaker::ToPKBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ScriptMaker *this,uint32_t key)

{
  undefined8 *puVar1;
  byte bVar2;
  ulong in_RCX;
  allocator_type *__a;
  long lVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> **__last;
  uchar *__first;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  allocator_type local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_8 = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  if (key == 0) {
    lVar3 = (in_RCX & 0xffffffff) * 0x41;
    __first = (uchar *)((long)this->m_keys + lVar3);
    bVar2 = *(byte *)((long)this->m_keys + lVar3);
    lVar3 = 0x21;
    if ((bVar2 & 0xfe) != 2) {
      bVar2 = bVar2 - 4;
      if (bVar2 < 4) {
        lVar3 = *(long *)(&DAT_004a5780 + (ulong)bVar2 * 8);
      }
      else {
        lVar3 = 0;
      }
    }
    __last = (vector<unsigned_char,_std::allocator<unsigned_char>_> **)(__first + lVar3);
    __a = (allocator_type *)&local_28;
  }
  else {
    if (key != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    lVar3 = (in_RCX & 0xffffffff) * 0x41;
    puVar1 = (undefined8 *)((long)this->m_keys + lVar3 + 1);
    local_28 = *puVar1;
    uStack_20 = puVar1[1];
    puVar1 = (undefined8 *)((long)this->m_keys + lVar3 + 0x11);
    local_18 = *puVar1;
    uStack_10 = puVar1[1];
    __last = &local_8;
    __first = (uchar *)&local_28;
    __a = &local_29;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             (uchar *)__last,__a);
  if (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28) == local_8) {
    return *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(uint32_t key) const {
        // In Tapscript keys always serialize as x-only, whether an x-only key was used in the descriptor or not.
        if (!miniscript::IsTapscript(m_script_ctx)) {
            return {m_keys[key].begin(), m_keys[key].end()};
        }
        const XOnlyPubKey xonly_pubkey{m_keys[key]};
        return {xonly_pubkey.begin(), xonly_pubkey.end()};
    }